

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O1

void lws_wsi_mux_sibling_disconnect(lws *wsi)

{
  uint *puVar1;
  lws *plVar2;
  lws *plVar3;
  char *pcVar4;
  lws **pplVar5;
  lws_log_cx_t *cx;
  
  plVar2 = (wsi->mux).parent_wsi;
  plVar3 = (plVar2->mux).child_list;
  if (plVar3 != (lws *)0x0) {
    if (plVar3 == wsi) {
      pplVar5 = &(plVar2->mux).child_list;
    }
    else {
      do {
        plVar2 = plVar3;
        plVar3 = (plVar2->mux).sibling_list;
        if (plVar3 == (lws *)0x0) goto LAB_00119b99;
      } while (plVar3 != wsi);
      pplVar5 = &(plVar2->mux).sibling_list;
    }
    plVar2 = (plVar3->mux).sibling_list;
    (plVar3->mux).sibling_list = (lws *)0x0;
    *pplVar5 = plVar2;
    if (wsi == (lws *)0x0) {
      cx = (lws_log_cx_t *)0x0;
    }
    else {
      cx = (wsi->lc).log_cx;
    }
    if (plVar2 == (lws *)0x0) {
      pcVar4 = "[null wsi]";
    }
    else {
      pcVar4 = lws_lc_tag(&plVar2->lc);
    }
    _lws_log_cx(cx,lws_log_prepend_wsi,wsi,0x10,"lws_wsi_mux_sibling_disconnect",
                " disentangled from sibling %s",pcVar4);
  }
LAB_00119b99:
  puVar1 = &(((wsi->mux).parent_wsi)->mux).child_count;
  *puVar1 = *puVar1 - 1;
  (wsi->mux).parent_wsi = (lws *)0x0;
  return;
}

Assistant:

void
lws_wsi_mux_sibling_disconnect(struct lws *wsi)
{
	struct lws *wsi2;

	lws_start_foreach_llp(struct lws **, w,
			      wsi->mux.parent_wsi->mux.child_list) {

		/* disconnect from siblings */
		if (*w == wsi) {
			wsi2 = (*w)->mux.sibling_list;
			(*w)->mux.sibling_list = NULL;
			*w = wsi2;
			lwsl_wsi_debug(wsi, " disentangled from sibling %s",
					    lws_wsi_tag(wsi2));
			break;
		}
	} lws_end_foreach_llp(w, mux.sibling_list);
	wsi->mux.parent_wsi->mux.child_count--;

	wsi->mux.parent_wsi = NULL;
}